

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visitStructOrUnionDeclaration_AtSpecifier
          (DeclarationBinder *this,StructOrUnionDeclarationSyntax *node)

{
  TagTypeSpecifierSyntax *this_00;
  Action AVar1;
  SyntaxKind SVar2;
  Identifier *pIVar3;
  TagType *pTVar4;
  ostream *poVar5;
  SyntaxToken SStack_58;
  
  this_00 = (node->super_TagDeclarationSyntax).typeSpec_;
  SVar2 = C::SyntaxNode::kind((SyntaxNode *)this_00);
  if (SVar2 == UnionTypeSpecifier) {
    TagTypeSpecifierSyntax::tagToken(&SStack_58,this_00);
    pIVar3 = obtainTag(this,&SStack_58);
    pTVar4 = makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                       (this,Union,pIVar3);
    SyntaxToken::~SyntaxToken(&SStack_58);
    bindDeclaration<psy::C::UnionDeclarationSymbol,psy::C::TagType*>(this,(SyntaxNode *)node,pTVar4)
    ;
  }
  else {
    if (SVar2 != StructTypeSpecifier) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x46);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,"<empty message>");
      std::endl<char,std::char_traits<char>>(poVar5);
      return Quit;
    }
    TagTypeSpecifierSyntax::tagToken(&SStack_58,this_00);
    pIVar3 = obtainTag(this,&SStack_58);
    pTVar4 = makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                       (this,Struct,pIVar3);
    SyntaxToken::~SyntaxToken(&SStack_58);
    bindDeclaration<psy::C::StructDeclarationSymbol,psy::C::TagType*>
              (this,(SyntaxNode *)node,pTVar4);
  }
  AVar1 = visitTagDeclaration_AtMemberDeclarations<psy::C::StructOrUnionDeclarationSyntax>
                    (this,node,0x306ac0);
  return AVar1;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitStructOrUnionDeclaration_AtSpecifier(
        const StructOrUnionDeclarationSyntax* node)
{
    const TagTypeSpecifierSyntax* tySpec = node->typeSpecifier();
    switch (tySpec->kind()) {
        case SyntaxKind::StructTypeSpecifier: {
            auto tagTy = makeType<TagType>(
                        TagTypeKind::Struct,
                        obtainTag(tySpec->tagToken()));
            bindDeclaration<StructDeclarationSymbol>(node, tagTy);
            break;
        }
        case SyntaxKind::UnionTypeSpecifier:{
            auto tagTy = makeType<TagType>(
                        TagTypeKind::Union,
                        obtainTag(tySpec->tagToken()));
            bindDeclaration<UnionDeclarationSymbol>(node, tagTy);
            break;
        }
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return visitTagDeclaration_AtMemberDeclarations(
                node,
                &DeclarationBinder::visitStructOrUnionDeclaration_AtEnd);
}